

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

int AMPLSLoadNLModel(AMPLS_MP_Solver *slv,char *nl_filename,char **options)

{
  long *plVar1;
  int iVar2;
  char *__s1;
  allocator<char> local_81;
  string filename_no_ext_;
  string nl_filename_;
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nl_filename_,nl_filename,(allocator<char> *)&filename_no_ext_);
  std::__cxx11::string::string((string *)&filename_no_ext_,(string *)&nl_filename_);
  __s1 = strrchr(nl_filename,0x2e);
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,".nl");
    if (iVar2 == 0) {
      std::__cxx11::string::resize((ulong)&filename_no_ext_);
      goto LAB_001cee1a;
    }
  }
  std::__cxx11::string::append((char *)&nl_filename_);
LAB_001cee1a:
  plVar1 = *slv->internal_info_;
  std::__cxx11::string::string<std::allocator<char>>(local_40,nl_filename,&local_81);
  (**(code **)(*plVar1 + 0x80))(plVar1,local_40,&filename_no_ext_,options);
  std::__cxx11::string::~string(local_40);
  (**(code **)(*plVar1 + 0x88))(plVar1);
  std::__cxx11::string::~string((string *)&filename_no_ext_);
  std::__cxx11::string::~string((string *)&nl_filename_);
  return 0;
}

Assistant:

int AMPLSLoadNLModel(AMPLS_MP_Solver* slv,
                     const char* nl_filename,
                     char** options) {
  return AMPLS__internal__TryCatchWrapper( slv, [=]() {
    std::string nl_filename_ = nl_filename;
    auto filename_no_ext_ = nl_filename_;
    const char *ext = std::strrchr(nl_filename, '.');
    if (!ext || std::strcmp(ext, ".nl") != 0)
      nl_filename_ += ".nl";
    else
      filename_no_ext_.resize(filename_no_ext_.size() - 3);

    auto be = AMPLSGetBackend(slv);
    be->ReadNL(nl_filename, filename_no_ext_, options);
    be->InputExtras();
  } );
}